

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O0

int uv__search_path(char *prog,char *buf,size_t *buflen)

{
  int iVar1;
  char *pcVar2;
  size_t *psVar3;
  int *piVar4;
  size_t sVar5;
  char *local_2058;
  char *itr;
  char *token;
  char *path_env;
  char *cloned_path;
  char trypath [4096];
  size_t abspath_size;
  char abspath [4096];
  size_t *buflen_local;
  char *buf_local;
  char *prog_local;
  
  if (((buf == (char *)0x0) || (buflen == (size_t *)0x0)) || (*buflen == 0)) {
    prog_local._4_4_ = -0x16;
  }
  else {
    abspath._4088_8_ = buflen;
    pcVar2 = strchr(prog,0x2f);
    if (pcVar2 == (char *)0x0) {
      path_env = (char *)0x0;
      itr = (char *)0x0;
      token = getenv("PATH");
      if (token == (char *)0x0) {
        prog_local._4_4_ = -0x16;
      }
      else {
        path_env = uv__strdup(token);
        if (path_env == (char *)0x0) {
          prog_local._4_4_ = -0xc;
        }
        else {
          itr = uv__strtok(path_env,":",&local_2058);
          while (itr != (char *)0x0) {
            snprintf((char *)&cloned_path,0xfff,"%s/%s",itr,prog);
            psVar3 = (size_t *)realpath((char *)&cloned_path,(char *)&abspath_size);
            if ((psVar3 == &abspath_size) && (iVar1 = access((char *)&abspath_size,1), iVar1 == 0))
            {
              sVar5 = strlen((char *)&abspath_size);
              *(long *)abspath._4088_8_ = *(long *)abspath._4088_8_ + -1;
              if (sVar5 < *(ulong *)abspath._4088_8_) {
                *(size_t *)abspath._4088_8_ = sVar5;
              }
              memcpy(buf,&abspath_size,*(size_t *)abspath._4088_8_);
              buf[*(long *)abspath._4088_8_] = '\0';
              uv__free(path_env);
              return 0;
            }
            itr = uv__strtok((char *)0x0,":",&local_2058);
          }
          uv__free(path_env);
          prog_local._4_4_ = -0x16;
        }
      }
    }
    else {
      psVar3 = (size_t *)realpath(prog,(char *)&abspath_size);
      if (psVar3 == &abspath_size) {
        sVar5 = strlen((char *)&abspath_size);
        *(long *)abspath._4088_8_ = *(long *)abspath._4088_8_ + -1;
        if (sVar5 < *(ulong *)abspath._4088_8_) {
          *(size_t *)abspath._4088_8_ = sVar5;
        }
        memcpy(buf,&abspath_size,*(size_t *)abspath._4088_8_);
        buf[*(long *)abspath._4088_8_] = '\0';
        prog_local._4_4_ = 0;
      }
      else {
        piVar4 = __errno_location();
        prog_local._4_4_ = -*piVar4;
      }
    }
  }
  return prog_local._4_4_;
}

Assistant:

int uv__search_path(const char* prog, char* buf, size_t* buflen) {
  char abspath[UV__PATH_MAX];
  size_t abspath_size;
  char trypath[UV__PATH_MAX];
  char* cloned_path;
  char* path_env;
  char* token;
  char* itr;

  if (buf == NULL || buflen == NULL || *buflen == 0)
    return UV_EINVAL;

  /*
   * Possibilities for prog:
   * i) an absolute path such as: /home/user/myprojects/nodejs/node
   * ii) a relative path such as: ./node or ../myprojects/nodejs/node
   * iii) a bare filename such as "node", after exporting PATH variable
   *     to its location.
   */

  /* Case i) and ii) absolute or relative paths */
  if (strchr(prog, '/') != NULL) {
    if (realpath(prog, abspath) != abspath)
      return UV__ERR(errno);

    abspath_size = strlen(abspath);

    *buflen -= 1;
    if (*buflen > abspath_size)
      *buflen = abspath_size;

    memcpy(buf, abspath, *buflen);
    buf[*buflen] = '\0';

    return 0;
  }

  /* Case iii). Search PATH environment variable */
  cloned_path = NULL;
  token = NULL;
  path_env = getenv("PATH");

  if (path_env == NULL)
    return UV_EINVAL;

  cloned_path = uv__strdup(path_env);
  if (cloned_path == NULL)
    return UV_ENOMEM;

  token = uv__strtok(cloned_path, ":", &itr);
  while (token != NULL) {
    snprintf(trypath, sizeof(trypath) - 1, "%s/%s", token, prog);
    if (realpath(trypath, abspath) == abspath) {
      /* Check the match is executable */
      if (access(abspath, X_OK) == 0) {
        abspath_size = strlen(abspath);

        *buflen -= 1;
        if (*buflen > abspath_size)
          *buflen = abspath_size;

        memcpy(buf, abspath, *buflen);
        buf[*buflen] = '\0';

        uv__free(cloned_path);
        return 0;
      }
    }
    token = uv__strtok(NULL, ":", &itr);
  }
  uv__free(cloned_path);

  /* Out of tokens (path entries), and no match found */
  return UV_EINVAL;
}